

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

void ncnn::binary_op_broadcast(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  float local_4c;
  long local_48;
  long local_40;
  long local_38;
  
  if (b->d * b->c * b->h * b->w * b->elempack == 1) {
    local_4c = *b->data;
    iVar10 = a->c;
    if (0 < (long)iVar10) {
      iVar6 = a->h;
      iVar4 = a->w;
      iVar7 = a->d;
      iVar5 = a->elempack;
      lVar13 = 0;
      do {
        binary_op_vector((float *)(a->cstep * lVar13 * a->elemsize + (long)a->data),&local_4c,
                         (float *)(c->cstep * lVar13 * c->elemsize + (long)c->data),
                         iVar6 * iVar4 * iVar7 * iVar5,1,1,1,op_type);
        lVar13 = lVar13 + 1;
      } while (iVar10 != lVar13);
    }
  }
  else {
    auVar3._0_4_ = b->dims;
    auVar3._4_4_ = b->w;
    auVar3._8_4_ = b->h;
    auVar3._12_4_ = b->d;
    auVar3 = vpinsrd_avx(auVar3,b->w,1);
    auVar3 = vpinsrd_avx(auVar3,b->h,2);
    auVar1._0_4_ = a->dims;
    auVar1._4_4_ = a->w;
    auVar1._8_4_ = a->h;
    auVar1._12_4_ = a->d;
    auVar3 = vpinsrd_avx(auVar3,b->d,3);
    uVar2 = a->c;
    auVar3 = vpcmpeqd_avx(auVar1,auVar3);
    iVar10 = vmovmskps_avx(auVar3);
    if ((iVar10 == 0xf && b->c == uVar2) && b->elempack == a->elempack) {
      if (0 < (int)uVar2) {
        iVar10 = auVar1._12_4_ * a->elempack * auVar1._8_4_ * auVar1._4_4_;
        uVar14 = 0;
        do {
          binary_op_vector((float *)(a->cstep * uVar14 * a->elemsize + (long)a->data),
                           (float *)(b->cstep * uVar14 * b->elemsize + (long)b->data),
                           (float *)(c->cstep * uVar14 * c->elemsize + (long)c->data),iVar10,iVar10,
                           1,1,op_type);
          uVar14 = uVar14 + 1;
        } while (uVar2 != uVar14);
      }
    }
    else {
      iVar10 = c->dims;
      if ((iVar10 == 2) && (iVar6 = c->h, 0 < (long)iVar6)) {
        lVar13 = 0;
        do {
          iVar4 = a->h + -1;
          iVar7 = (int)lVar13;
          if (iVar7 <= iVar4) {
            iVar4 = iVar7;
          }
          iVar5 = b->h + -1;
          if (iVar7 <= iVar5) {
            iVar5 = iVar7;
          }
          binary_op_vector((float *)((long)iVar4 * (long)a->w * a->elemsize + (long)a->data),
                           (float *)((long)iVar5 * (long)b->w * b->elemsize + (long)b->data),
                           (float *)(c->w * lVar13 * c->elemsize + (long)c->data),a->w,b->w,
                           a->elempack,b->elempack,op_type);
          lVar13 = lVar13 + 1;
        } while (iVar6 != lVar13);
      }
      if ((iVar10 - 3U < 2) && (local_48 = (long)c->c, 0 < local_48)) {
        lVar13 = 0;
        do {
          iVar10 = a->c + -1;
          iVar6 = (int)lVar13;
          if (iVar6 <= iVar10) {
            iVar10 = iVar6;
          }
          iVar4 = b->c + -1;
          if (iVar6 <= iVar4) {
            iVar4 = iVar6;
          }
          iVar6 = b->h * b->w;
          if (b->d * iVar6 == 1) {
            binary_op_vector((float *)((long)iVar10 * a->cstep * a->elemsize + (long)a->data),
                             (float *)((long)iVar4 * b->cstep * b->elemsize + (long)b->data),
                             (float *)(c->cstep * lVar13 * c->elemsize + (long)c->data),
                             a->h * a->w * a->d,1,a->elempack,b->elempack,op_type);
          }
          else if (iVar6 == 1) {
            if (0 < c->d) {
              lVar9 = 0;
              do {
                iVar6 = a->d + -1;
                iVar7 = (int)lVar9;
                if (iVar7 <= iVar6) {
                  iVar6 = iVar7;
                }
                iVar5 = b->d + -1;
                if (iVar7 <= iVar5) {
                  iVar5 = iVar7;
                }
                binary_op_vector((float *)((long)a->data +
                                          (long)a->w * (long)a->h * a->elemsize * (long)iVar6 +
                                          a->cstep * (long)iVar10 * a->elemsize),
                                 (float *)((long)b->data +
                                          (long)b->h * (long)b->w * b->elemsize * (long)iVar5 +
                                          b->cstep * (long)iVar4 * b->elemsize),
                                 (float *)((long)c->data +
                                          (long)c->h * c->elemsize * c->w * lVar9 +
                                          c->cstep * lVar13 * c->elemsize),a->h * a->w,1,a->elempack
                                 ,b->elempack,op_type);
                lVar9 = lVar9 + 1;
              } while (lVar9 < c->d);
            }
          }
          else if (0 < c->d) {
            lVar9 = 0;
            do {
              if (0 < c->h) {
                iVar6 = b->d + -1;
                iVar7 = (int)lVar9;
                if (iVar7 <= iVar6) {
                  iVar6 = iVar7;
                }
                iVar5 = a->d + -1;
                if (iVar7 <= iVar5) {
                  iVar5 = iVar7;
                }
                local_38 = (long)iVar5;
                local_40 = (long)iVar6;
                lVar15 = 0;
                do {
                  iVar6 = a->h + -1;
                  iVar7 = (int)lVar15;
                  if (iVar7 <= iVar6) {
                    iVar6 = iVar7;
                  }
                  iVar5 = b->h + -1;
                  if (iVar7 <= iVar5) {
                    iVar5 = iVar7;
                  }
                  lVar11 = a->elemsize * (long)a->w;
                  lVar12 = b->elemsize * (long)b->w;
                  lVar8 = (long)c->w * c->elemsize;
                  binary_op_vector((float *)((long)a->data +
                                            iVar6 * lVar11 + a->h * local_38 * lVar11 +
                                            a->cstep * (long)iVar10 * a->elemsize),
                                   (float *)((long)b->data +
                                            iVar5 * lVar12 + b->h * local_40 * lVar12 +
                                            b->cstep * (long)iVar4 * b->elemsize),
                                   (float *)((long)c->data +
                                            lVar8 * lVar15 + c->h * lVar9 * lVar8 +
                                            c->cstep * lVar13 * c->elemsize),a->w,b->w,a->elempack,
                                   b->elempack,op_type);
                  lVar15 = lVar15 + 1;
                } while (lVar15 < c->h);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < c->d);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != local_48);
      }
    }
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    if (b.w * b.h * b.d * b.c * b.elempack == 1)
    {
        return binary_op_scalar(a, b[0], c, op_type, opt);
    }

    if (a.dims == b.dims && a.w == b.w && a.h == b.h && a.d == b.d && a.c == b.c && a.elempack == b.elempack)
    {
        return binary_op_no_broadcast(a, b, c, op_type, opt);
    }

    const int dims = c.dims;

    if (dims == 2)
    {
        const int h = c.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const int y0 = std::min(y, a.h - 1);
            const int y1 = std::min(y, b.h - 1);

            const float* ptr = a.row(y0);
            const float* ptr1 = b.row(y1);
            float* outptr = c.row(y);

            binary_op_vector(ptr, ptr1, outptr, a.w, b.w, a.elempack, b.elempack, op_type);
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int channels = c.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int q0 = std::min(q, a.c - 1);
            const int q1 = std::min(q, b.c - 1);

            if (b.d * b.h * b.w == 1)
            {
                const float* ptr = a.channel(q0);
                const float* ptr1 = b.channel(q1);
                float* outptr = c.channel(q);

                binary_op_vector(ptr, ptr1, outptr, a.w * a.h * a.d, 1, a.elempack, b.elempack, op_type);
                continue;
            }

            if (b.h * b.w == 1)
            {
                for (int z = 0; z < c.d; z++)
                {
                    const int z0 = std::min(z, a.d - 1);
                    const int z1 = std::min(z, b.d - 1);

                    const float* ptr = a.channel(q0).depth(z0);
                    const float* ptr1 = b.channel(q1).depth(z1);
                    float* outptr = c.channel(q).depth(z);

                    binary_op_vector(ptr, ptr1, outptr, a.w * a.h, 1, a.elempack, b.elempack, op_type);
                }
                continue;
            }

            for (int z = 0; z < c.d; z++)
            {
                const int z0 = std::min(z, a.d - 1);
                const int z1 = std::min(z, b.d - 1);

                for (int y = 0; y < c.h; y++)
                {
                    const int y0 = std::min(y, a.h - 1);
                    const int y1 = std::min(y, b.h - 1);

                    const float* ptr = a.channel(q0).depth(z0).row(y0);
                    const float* ptr1 = b.channel(q1).depth(z1).row(y1);
                    float* outptr = c.channel(q).depth(z).row(y);

                    binary_op_vector(ptr, ptr1, outptr, a.w, b.w, a.elempack, b.elempack, op_type);
                }
            }
        }
    }
}